

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wield.c
# Opt level: O0

void erode_obj(obj *target,boolean acid_dmg,boolean fade_scrolls)

{
  ushort uVar1;
  byte bVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  char *local_90;
  char *local_80;
  char *local_68;
  uint local_44;
  monst *local_38;
  monst *local_30;
  boolean visobj;
  boolean vismon;
  monst *victim;
  int erosion;
  boolean fade_scrolls_local;
  boolean acid_dmg_local;
  obj *target_local;
  
  if (target == (obj *)0x0) {
    return;
  }
  if (target->where == '\x03') {
    local_30 = &youmonst;
  }
  else {
    if (target->where == '\x04') {
      local_38 = (target->v).v_ocarry;
    }
    else {
      local_38 = (monst *)0x0;
    }
    local_30 = local_38;
  }
  bVar7 = false;
  if ((local_30 != (monst *)0x0) && (bVar7 = false, local_30 != &youmonst)) {
    if (local_30->wormno == '\0') {
      if ((viz_array[local_30->my][local_30->mx] & 2U) == 0) {
        if ((((u.uprops[0x1e].intrinsic != 0) ||
             (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
              (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
            ((bVar7 = false, ublindf == (obj *)0x0 || (bVar7 = false, ublindf->oartifact != '\x1d'))
            )) || (((u.uprops[0x40].intrinsic == 0 &&
                    ((u.uprops[0x40].extrinsic == 0 &&
                     (bVar7 = false, ((youmonst.data)->mflags3 & 0x100) == 0)))) ||
                   (bVar7 = false, (local_30->data->mflags3 & 0x200) == 0)))) goto LAB_0033d0d8;
        bVar2 = viz_array[local_30->my][local_30->mx] & 1;
        goto joined_r0x0033d01f;
      }
    }
    else {
      bVar2 = worm_known(level,local_30);
joined_r0x0033d01f:
      bVar7 = false;
      if (bVar2 == 0) goto LAB_0033d0d8;
    }
    if ((((((*(uint *)&local_30->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
         (u.uprops[0xc].extrinsic != 0)) ||
        (bVar7 = false, ((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
       (bVar7 = false, (*(uint *)&local_30->field_0x60 >> 7 & 1) == 0)) {
      bVar7 = (*(uint *)&local_30->field_0x60 >> 9 & 1) == 0 && ((byte)u._1052_1_ >> 5 & 1) == 0;
    }
  }
LAB_0033d0d8:
  bVar6 = false;
  if (local_30 == (monst *)0x0) {
    bVar6 = (viz_array[bhitpos.y][bhitpos.x] & 2U) != 0;
  }
  if (acid_dmg == '\0') {
    local_44 = *(uint *)&target->field_0x4a >> 8;
  }
  else {
    local_44 = *(uint *)&target->field_0x4a >> 10;
  }
  local_44 = local_44 & 3;
  if ((*(uint *)&target->field_0x4a >> 0x14 & 1) != 0) {
    grease_protect(target,(char *)0x0,local_30);
    return;
  }
  if (target->oclass == '\t') {
    if (fade_scrolls == '\0') {
      return;
    }
    if (target->otyp == 0x17c) {
      return;
    }
    if ((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
        && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
      if (local_30 == &youmonst) {
        pcVar3 = aobjnam(target,"fade");
        pline("Your %s.",pcVar3);
      }
      else if (bVar7) {
        pcVar3 = Monnam(local_30);
        pcVar4 = aobjnam(target,"fade");
        pline("%s\'s %s.",pcVar3,pcVar4);
      }
      else if (bVar6) {
        pcVar3 = aobjnam(target,"fade");
        pline("The %s.",pcVar3);
      }
    }
    target->otyp = 0x17c;
    target->spe = '\0';
    return;
  }
  if ((*(uint *)&target->field_0x4a >> 0xc & 1) == 0) {
    if (acid_dmg == '\0') {
      uVar1 = *(ushort *)&objects[target->otyp].field_0x11;
joined_r0x0033d38c:
      if ((uVar1 >> 4 & 0x1f) != 0xb) goto LAB_0033d392;
    }
    else if ((*(ushort *)&objects[target->otyp].field_0x11 >> 4 & 0x1f) != 0xd) {
      uVar1 = *(ushort *)&objects[target->otyp].field_0x11;
      goto joined_r0x0033d38c;
    }
    if (local_44 < 3) {
      if (local_30 == &youmonst) {
        pcVar3 = "rust";
        if (acid_dmg != '\0') {
          pcVar3 = "corrode";
        }
        pcVar3 = aobjnam(target,pcVar3);
        if (local_44 == 2) {
          local_68 = " completely";
        }
        else {
          local_68 = "";
          if (local_44 != 0) {
            local_68 = " further";
          }
        }
        pline("Your %s%s!",pcVar3,local_68);
      }
      else if (bVar7) {
        pcVar3 = Monnam(local_30);
        pcVar4 = "rust";
        if (acid_dmg != '\0') {
          pcVar4 = "corrode";
        }
        pcVar4 = aobjnam(target,pcVar4);
        if (local_44 == 2) {
          local_80 = " completely";
        }
        else {
          local_80 = "";
          if (local_44 != 0) {
            local_80 = " further";
          }
        }
        pline("%s\'s %s%s!",pcVar3,pcVar4,local_80);
      }
      else if (bVar6) {
        pcVar3 = "rust";
        if (acid_dmg != '\0') {
          pcVar3 = "corrode";
        }
        pcVar3 = aobjnam(target,pcVar3);
        if (local_44 == 2) {
          local_90 = " completely";
        }
        else {
          local_90 = "";
          if (local_44 != 0) {
            local_90 = " further";
          }
        }
        pline("The %s%s!",pcVar3,local_90);
      }
      if (acid_dmg == '\0') {
        *(uint *)&target->field_0x4a =
             *(uint *)&target->field_0x4a & 0xfffffcff |
             ((*(uint *)&target->field_0x4a >> 8 & 3) + 1 & 3) << 8;
      }
      else {
        *(uint *)&target->field_0x4a =
             *(uint *)&target->field_0x4a & 0xfffff3ff |
             ((*(uint *)&target->field_0x4a >> 10 & 3) + 1 & 3) << 10;
      }
    }
    else if (flags.verbose != '\0') {
      if (local_30 == &youmonst) {
        if (((u.uprops[0x1e].intrinsic != 0) || ((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)))
            ) || (bVar7 = false, ((youmonst.data)->mflags1 & 0x1000) != 0)) {
          bVar7 = false;
          if (ublindf != (obj *)0x0) {
            bVar7 = ublindf->oartifact == '\x1d';
          }
          bVar7 = (bool)(bVar7 ^ 1);
        }
        pcVar3 = "look";
        if (bVar7) {
          pcVar3 = "feel";
        }
        pcVar3 = aobjnam(target,pcVar3);
        pcVar4 = "rusty";
        if (acid_dmg != '\0') {
          pcVar4 = "corroded";
        }
        pline("Your %s completely %s.",pcVar3,pcVar4);
      }
      else if (bVar7) {
        pcVar3 = Monnam(local_30);
        pcVar4 = aobjnam(target,"look");
        pcVar5 = "rusty";
        if (acid_dmg != '\0') {
          pcVar5 = "corroded";
        }
        pline("%s\'s %s completely %s.",pcVar3,pcVar4,pcVar5);
      }
      else if (bVar6) {
        pcVar3 = aobjnam(target,"look");
        pcVar4 = "rusty";
        if (acid_dmg != '\0') {
          pcVar4 = "corroded";
        }
        pline("The %s completely %s.",pcVar3,pcVar4);
      }
    }
  }
  else {
LAB_0033d392:
    if (((flags.verbose != '\0') || ((*(uint *)&target->field_0x4a >> 0xc & 1) == 0)) ||
       ((*(uint *)&target->field_0x4a >> 7 & 1) == 0)) {
      if (local_30 == &youmonst) {
        pcVar3 = aobjnam(target,"are");
        pline("Your %s not affected.",pcVar3);
      }
      else if (bVar7) {
        pcVar3 = Monnam(local_30);
        pcVar4 = aobjnam(target,"are");
        pline("%s\'s %s not affected.",pcVar3,pcVar4);
      }
    }
    if ((*(uint *)&target->field_0x4a >> 0xc & 1) != 0) {
      *(uint *)&target->field_0x4a = *(uint *)&target->field_0x4a & 0xffffff7f | 0x80;
    }
  }
  return;
}

Assistant:

void erode_obj(struct obj *target, /* object (e.g. weapon or armor) to erode */
	       boolean acid_dmg,
	       boolean fade_scrolls)
{
	int erosion;
	struct monst *victim;
	boolean vismon;
	boolean visobj;

	if (!target)
	    return;
	victim = carried(target) ? &youmonst :
	    mcarried(target) ? target->ocarry : NULL;
	vismon = victim && (victim != &youmonst) && canseemon(level, victim);
	visobj = !victim && cansee(bhitpos.x, bhitpos.y); /* assume thrown */

	erosion = acid_dmg ? target->oeroded2 : target->oeroded;

	if (target->greased) {
	    grease_protect(target,NULL,victim);
	} else if (target->oclass == SCROLL_CLASS) {
	    if (fade_scrolls && target->otyp != SCR_BLANK_PAPER)
	    {
		if (!Blind) {
		    if (victim == &youmonst)
			pline("Your %s.", aobjnam(target, "fade"));
		    else if (vismon)
			pline("%s's %s.", Monnam(victim),
			      aobjnam(target, "fade"));
		    else if (visobj)
			pline("The %s.", aobjnam(target, "fade"));
		}
		target->otyp = SCR_BLANK_PAPER;
		target->spe = 0;
	    }
	} else if (target->oerodeproof ||
		(acid_dmg ? !is_corrodeable(target) : !is_rustprone(target))) {
	    if (flags.verbose || !(target->oerodeproof && target->rknown)) {
		if (victim == &youmonst)
		    pline("Your %s not affected.", aobjnam(target, "are"));
		else if (vismon)
		    pline("%s's %s not affected.", Monnam(victim),
			aobjnam(target, "are"));
		/* no message if not carried */
	    }
	    if (target->oerodeproof) target->rknown = TRUE;
	} else if (erosion < MAX_ERODE) {
	    if (victim == &youmonst)
		pline("Your %s%s!", aobjnam(target, acid_dmg ? "corrode" : "rust"),
		    erosion+1 == MAX_ERODE ? " completely" :
		    erosion ? " further" : "");
	    else if (vismon)
		pline("%s's %s%s!", Monnam(victim),
		    aobjnam(target, acid_dmg ? "corrode" : "rust"),
		    erosion+1 == MAX_ERODE ? " completely" :
		    erosion ? " further" : "");
	    else if (visobj)
		pline("The %s%s!",
		    aobjnam(target, acid_dmg ? "corrode" : "rust"),
		    erosion+1 == MAX_ERODE ? " completely" :
		    erosion ? " further" : "");
	    if (acid_dmg)
		target->oeroded2++;
	    else
		target->oeroded++;
	} else {
	    if (flags.verbose) {
		if (victim == &youmonst)
		    pline("Your %s completely %s.",
			aobjnam(target, Blind ? "feel" : "look"),
			acid_dmg ? "corroded" : "rusty");
		else if (vismon)
		    pline("%s's %s completely %s.", Monnam(victim),
			aobjnam(target, "look"),
			acid_dmg ? "corroded" : "rusty");
		else if (visobj)
		    pline("The %s completely %s.",
			aobjnam(target, "look"),
			acid_dmg ? "corroded" : "rusty");
	    }
	}
}